

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double __thiscall CEDate::GetDate(CEDate *this,CEDateType time_format)

{
  undefined8 uVar1;
  int in_ESI;
  long *in_RDI;
  double date;
  allocator local_71;
  string local_70 [48];
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  invalid_value *in_stack_ffffffffffffffd0;
  double local_18;
  
  if (in_ESI == 0) {
    local_18 = (double)(**(code **)(*in_RDI + 0x20))();
  }
  else if (in_ESI == 1) {
    local_18 = (double)(**(code **)(*in_RDI + 0x28))();
  }
  else {
    if (in_ESI != 2) {
      uVar1 = __cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc8,"CEDate::GetDate()",
                 (allocator *)&stack0xffffffffffffffc7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Unrecognized time format!",&local_71);
      CEException::invalid_value::invalid_value
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,
                  CEException::invalid_value::~invalid_value);
    }
    local_18 = (double)(**(code **)(*in_RDI + 0x30))();
  }
  return local_18;
}

Assistant:

double CEDate::GetDate(CEDateType time_format) const
{
    // Initialize the return date
    double date(0);

    // Return the julian date if requested
    if (time_format == CEDateType::JD) {
        date = JD() ;
    } else if (time_format == CEDateType::MJD) {
        date = MJD() ;
    } else if (time_format == CEDateType::GREGORIAN) {
        date = Gregorian() ;
    } else {
        throw CEException::invalid_value("CEDate::GetDate()", 
                                         "Unrecognized time format!");
    }

    return date;
}